

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_posix.h
# Opt level: O1

int loadScript(char *filePath,long uline,void *thunk,
              _func_int_char_ptr_long_int_ptr_void_ptr *evalFunc)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  FILE *__stream;
  char *__s;
  ushort **ppuVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  stat buf;
  ulong local_f8;
  long local_f0;
  int local_e4;
  int local_d8;
  stat local_c0;
  
  iVar2 = stat(filePath,&local_c0);
  local_e4 = 0;
  if ((iVar2 != 0) || ((local_c0.st_mode & 0xf000) != 0x4000)) {
    __stream = fopen(filePath,"r");
    local_e4 = 0;
    if (__stream != (FILE *)0x0) {
      local_f8 = 0x1000;
      __s = (char *)malloc(0x1000);
      local_e4 = 1;
      do {
        iVar2 = feof(__stream);
        if (iVar2 != 0) break;
        uVar11 = 0;
        memset(__s,0,local_f8);
        local_f0 = uline;
        bVar1 = false;
        uVar6 = 0;
LAB_00103429:
        do {
          uVar3 = fgetc(__stream);
        } while (uVar3 == 0xd);
        if (uVar3 != 0xffffffff) {
          if (local_f8 <= uVar11) {
            local_f8 = local_f8 * 2;
            __s = (char *)realloc(__s,local_f8);
          }
          local_f0 = local_f0 + (ulong)(uVar3 == 10);
          __s[uVar11] = (char)uVar3;
          uVar11 = uVar11 + 1;
          if (uVar3 == 0x2a && uVar6 == 0x2f) {
            iVar10 = 1;
            iVar2 = 0;
            do {
              do {
                iVar5 = fgetc(__stream);
              } while (iVar5 == 0xd);
              if (iVar5 == -1) {
                uVar6 = 0x2f;
                break;
              }
              if (iVar5 == 10) {
                local_f0 = local_f0 + 1;
              }
              if (local_f8 <= uVar11) {
                local_f8 = local_f8 * 2;
                __s = (char *)realloc(__s,local_f8);
              }
              __s[uVar11] = (char)iVar5;
              uVar11 = uVar11 + 1;
              uVar6 = 0x2f;
              iVar10 = (iVar10 - (uint)(iVar5 == 0x2f && iVar2 == 0x2a)) +
                       (uint)(iVar5 == 0x2a && iVar2 == 0x2f);
              iVar2 = iVar5;
            } while (iVar10 != 0);
          }
          else if ((uVar3 - 0x22 < 0x3f) &&
                  (uVar7 = uVar3, (0x4000000000000021U >> ((ulong)(uVar3 - 0x22) & 0x3f) & 1) != 0))
          {
            do {
              do {
                uVar4 = fgetc(__stream);
              } while (uVar4 == 0xd);
              if (uVar4 == 0xffffffff) break;
              if (uVar4 == 10) {
                local_f0 = local_f0 + 1;
              }
              if (local_f8 <= uVar11) {
                local_f8 = local_f8 * 2;
                __s = (char *)realloc(__s,local_f8);
              }
              __s[uVar11] = (char)uVar4;
              uVar11 = uVar11 + 1;
              bVar12 = uVar7 == 0x5c;
              uVar7 = uVar4;
            } while (bVar12 || uVar4 != uVar3);
          }
          else {
            uVar7 = uVar6 ^ 10;
            if ((uVar3 == 10 && uVar7 == 0) && !bVar1) goto LAB_001035e8;
            if (uVar6 == 0x7b) {
              bVar1 = true;
            }
            uVar6 = uVar3;
            if (uVar7 == 0 && uVar3 == 0x7d) {
              bVar1 = false;
            }
          }
          goto LAB_00103429;
        }
LAB_001035e8:
        local_d8 = (int)uline;
        if ((((local_d8 == 1) && (2 < uVar11)) && (*__s == '#')) && (__s[1] == '!')) {
          uVar11 = 0;
        }
        bVar1 = true;
        if (uVar11 != 0) {
          ppuVar8 = __ctype_b_loc();
          uVar9 = 0;
          do {
            if ((*(byte *)((long)*ppuVar8 + (long)__s[uVar9] * 2 + 1) & 0x20) == 0) {
              local_c0.st_dev._0_4_ = 0;
              local_e4 = (*evalFunc)(__s,uline,(int *)&local_c0,thunk);
              bVar1 = (int)local_c0.st_dev == 0 && local_e4 != 0;
              break;
            }
            uVar9 = uVar9 + 1;
          } while (uVar11 != uVar9);
        }
        uline = local_f0;
      } while (bVar1);
      free(__s);
      fclose(__stream);
    }
  }
  return local_e4;
}

Assistant:

static int loadScript(const char *filePath, long uline, void *thunk, int (*evalFunc)(const char*, long, int *, void *))
{
	int isSuccessfullyLoading = false;
	if(isDir(filePath)) {
		return isSuccessfullyLoading;
	}
	FILE *fp = fopen(filePath, "r");
	if(fp != NULL) {
		SimpleBuffer simpleBuffer;
		simpleBuffer.buffer = (char *)malloc(K_PAGESIZE);
		simpleBuffer.allocSize = K_PAGESIZE;
		isSuccessfullyLoading = true;
		while(!feof(fp)) {
			kfileline_t rangeheadline = uline;
			khalfword_t sline = (khalfword_t)uline;
			bzero(simpleBuffer.buffer, simpleBuffer.allocSize);
			simpleBuffer.size = 0;
			uline = readChunk(fp, uline, &simpleBuffer);
			const char *script = (const char *)simpleBuffer.buffer;
			if(sline == 1 && simpleBuffer.size > 2 && script[0] == '#' && script[1] == '!') {
				// fall through this line
				simpleBuffer.size = 0;
				//TODO: do we increment uline??
			}
			if(!isEmptyChunk(script, simpleBuffer.size)) {
				int isBreak = false;
				isSuccessfullyLoading = evalFunc(script, rangeheadline, &isBreak, thunk);
				if(!isSuccessfullyLoading|| isBreak) {
					break;
				}
			}
		}
		free(simpleBuffer.buffer);
		fclose(fp);
	}
	return isSuccessfullyLoading;
}